

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reflection.h
# Opt level: O1

void __thiscall
google::protobuf::RepeatedFieldRef<google::protobuf::Message,_void>::RepeatedFieldRef
          (RepeatedFieldRef<google::protobuf::Message,_void> *this,
          MakeDependent<google::protobuf::Message,_Message> *message,FieldDescriptor *field)

{
  int iVar1;
  void *pvVar2;
  RepeatedFieldAccessor *pRVar3;
  MessageFactory *pMVar4;
  Descriptor *pDVar5;
  undefined4 extraout_var;
  Reflection *this_00;
  Metadata MVar6;
  
  MVar6 = Message::GetMetadata(message);
  this_00 = MVar6.reflection;
  pvVar2 = Reflection::RepeatedFieldData(this_00,message,field,CPPTYPE_MESSAGE,(Descriptor *)0x0);
  this->data_ = pvVar2;
  pRVar3 = Reflection::RepeatedFieldAccessor(this_00,field);
  this->accessor_ = pRVar3;
  pMVar4 = Reflection::GetMessageFactory(this_00);
  pDVar5 = FieldDescriptor::message_type(field);
  iVar1 = (*pMVar4->_vptr_MessageFactory[2])(pMVar4,pDVar5);
  this->default_instance_ = (Message *)CONCAT44(extraout_var,iVar1);
  return;
}

Assistant:

RepeatedFieldRef(const MakeDependent<T, Message>& message,
                   const FieldDescriptor* field) {
    const auto* reflection = message.GetReflection();
    data_ = reflection->RepeatedFieldData(
        message, field, internal::RefTypeTraits<T>::cpp_type,
        internal::RefTypeTraits<T>::GetMessageFieldDescriptor());
    accessor_ = reflection->RepeatedFieldAccessor(field);
    default_instance_ = static_cast<const T*>(
        reflection->GetMessageFactory()->GetPrototype(field->message_type()));
  }